

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitter.cpp
# Opt level: O3

Error __thiscall asmjit::v1_14::BaseEmitter::commentf(BaseEmitter *this,char *fmt,...)

{
  ErrorHandler *pEVar1;
  char in_AL;
  Error _err;
  Error EVar2;
  char *pcVar3;
  undefined8 in_RCX;
  undefined8 in_RDX;
  ulong uVar4;
  undefined1 *puVar5;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  __va_list_tag local_518;
  undefined1 local_4f8 [16];
  undefined8 local_4e8;
  undefined8 local_4e0;
  undefined8 local_4d8;
  undefined8 local_4d0;
  undefined4 local_4c8;
  undefined8 local_4b8;
  undefined8 local_4a8;
  undefined8 local_498;
  undefined8 local_488;
  undefined8 local_478;
  undefined8 local_468;
  undefined8 local_458;
  undefined8 local_448;
  ulong uStack_440;
  undefined8 local_438;
  undefined1 *local_430;
  undefined1 local_428 [1040];
  
  if (in_AL != '\0') {
    local_4c8 = in_XMM0_Da;
    local_4b8 = in_XMM1_Qa;
    local_4a8 = in_XMM2_Qa;
    local_498 = in_XMM3_Qa;
    local_488 = in_XMM4_Qa;
    local_478 = in_XMM5_Qa;
    local_468 = in_XMM6_Qa;
    local_458 = in_XMM7_Qa;
  }
  local_4e8 = in_RDX;
  local_4e0 = in_RCX;
  local_4d8 = in_R8;
  local_4d0 = in_R9;
  if ((this->_emitterFlags & kLogComments) == kNone) {
    EVar2 = 0;
    if ((this->_emitterFlags & kAttached) == kNone) {
      pEVar1 = this->_errorHandler;
      EVar2 = 5;
      if (pEVar1 != (ErrorHandler *)0x0) {
        pcVar3 = DebugUtils::errorAsString(5);
        (*pEVar1->_vptr_ErrorHandler[2])(pEVar1,5,pcVar3,this);
      }
    }
  }
  else {
    local_430 = local_428;
    uStack_440 = 0;
    local_448 = 0x20;
    local_438 = 0x407;
    local_428[0] = 0;
    local_518.reg_save_area = local_4f8;
    local_518.overflow_arg_area = &ap[0].overflow_arg_area;
    local_518.gp_offset = 0x10;
    local_518.fp_offset = 0x30;
    EVar2 = String::_opVFormat((String *)&local_448,kAppend,fmt,&local_518);
    if (EVar2 == 0) {
      uVar4 = uStack_440;
      puVar5 = local_430;
      if ((local_448 & 0xff) < 0x1f) {
        uVar4 = local_448 & 0xff;
        puVar5 = (undefined1 *)((long)&local_448 + 1);
      }
      EVar2 = (*this->_vptr_BaseEmitter[0xf])(this,puVar5,uVar4);
    }
    String::reset((String *)&local_448);
  }
  return EVar2;
}

Assistant:

Error BaseEmitter::commentf(const char* fmt, ...) {
  if (!hasEmitterFlag(EmitterFlags::kLogComments)) {
    if (!hasEmitterFlag(EmitterFlags::kAttached))
      return reportError(DebugUtils::errored(kErrorNotInitialized));
    return kErrorOk;
  }

#ifndef ASMJIT_NO_LOGGING
  StringTmp<1024> sb;

  va_list ap;
  va_start(ap, fmt);
  Error err = sb.appendVFormat(fmt, ap);
  va_end(ap);

  ASMJIT_PROPAGATE(err);
  return comment(sb.data(), sb.size());
#else
  DebugUtils::unused(fmt);
  return kErrorOk;
#endif
}